

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,char *str,char *str_end)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImU32 IVar3;
  size_t data_size;
  
  iVar2 = (this->IDStack).Size;
  if (iVar2 < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
    iVar2 = (this->IDStack).Size;
  }
  data_size = (long)str_end - (long)str;
  if (str_end == (char *)0x0) {
    data_size = 0;
  }
  IVar3 = ImHashStr(str,data_size,(this->IDStack).Data[(long)iVar2 + -1]);
  pIVar1 = GImGui;
  if (GImGui->ActiveId == IVar3) {
    GImGui->ActiveIdIsAlive = IVar3;
  }
  if (pIVar1->ActiveIdPreviousFrame == IVar3) {
    pIVar1->ActiveIdPreviousFrameIsAlive = true;
  }
  return IVar3;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO2(id, ImGuiDataType_String, str, str_end);
#endif
    return id;
}